

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_math.c
# Opt level: O1

int jpc_floorlog2(int x)

{
  bool bVar1;
  int iVar2;
  
  if (0 < x) {
    iVar2 = 0;
    if (x != 1) {
      iVar2 = 0;
      do {
        iVar2 = iVar2 + 1;
        bVar1 = 3 < (uint)x;
        x = (uint)x >> 1;
      } while (bVar1);
    }
    return iVar2;
  }
  __assert_fail("x > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_math.c"
                ,0x59,"int jpc_floorlog2(int)");
}

Assistant:

int jpc_floorlog2(int x)
{
	int y;

	/* The argument must be positive. */
	assert(x > 0);

	y = 0;
	while (x > 1) {
		x >>= 1;
		++y;
	}
	return y;
}